

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void __thiscall
ImDrawList::AddBezierQuadratic
          (ImDrawList *this,ImVec2 *p1,ImVec2 *p2,ImVec2 *p3,ImU32 col,float thickness,
          int num_segments)

{
  if (col < 0x1000000) {
    return;
  }
  ImVector<ImVec2>::push_back(&this->_Path,p1);
  PathBezierQuadraticCurveTo(this,p2,p3,num_segments);
  PathStroke(this,col,false,thickness);
  return;
}

Assistant:

void ImDrawList::AddBezierQuadratic(const ImVec2& p1, const ImVec2& p2, const ImVec2& p3, ImU32 col, float thickness, int num_segments)
{
    if ((col & IM_COL32_A_MASK) == 0)
        return;

    PathLineTo(p1);
    PathBezierQuadraticCurveTo(p2, p3, num_segments);
    PathStroke(col, false, thickness);
}